

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity_type.cpp
# Opt level: O0

void __thiscall EnemyType::apply_health_factor(EnemyType *this,double factor)

{
  double local_20;
  double factored_health;
  double factor_local;
  EnemyType *this_local;
  
  if (((this->super_EntityType).field_0x64 != -1) && ((this->super_EntityType).field_0x64 != '\0'))
  {
    local_20 = round((double)(byte)(this->super_EntityType).field_0x64 * factor);
    if (254.0 < local_20) {
      local_20 = 254.0;
    }
    if (local_20 < 1.0) {
      local_20 = 1.0;
    }
    (this->super_EntityType).field_0x64 = (char)(int)local_20;
  }
  return;
}

Assistant:

void EnemyType::apply_health_factor(double factor)
{
    if(_health < 255 && _health >= 1)
    {
        double factored_health = std::round(static_cast<uint16_t>(_health) * factor);
        if (factored_health > 254)
            factored_health = 254;
        if (factored_health < 1)
            factored_health = 1;
        _health = static_cast<uint8_t>(factored_health);
    }
}